

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O0

bool __thiscall amrex::Box::operator<(Box *this,Box *rhs)

{
  bool bVar1;
  bool local_173;
  bool local_172;
  bool local_171;
  bool local_162;
  bool local_161;
  bool local_154;
  bool local_141;
  bool local_131;
  Box *rhs_local;
  Box *this_local;
  
  local_131 = true;
  if ((rhs->btype).itype <= (this->btype).itype) {
    local_141 = false;
    if ((rhs->btype).itype == (this->btype).itype) {
      bVar1 = true;
      if (((((rhs->smallend).vect[2] <= (this->smallend).vect[2]) &&
           (bVar1 = false, (this->smallend).vect[2] == (rhs->smallend).vect[2])) &&
          (bVar1 = true, (rhs->smallend).vect[1] <= (this->smallend).vect[1])) &&
         (bVar1 = false, (this->smallend).vect[1] == (rhs->smallend).vect[1])) {
        bVar1 = (this->smallend).vect[0] < (rhs->smallend).vect[0];
      }
      local_154 = true;
      if (!bVar1) {
        bVar1 = false;
        if (((this->smallend).vect[0] == (rhs->smallend).vect[0]) &&
           (bVar1 = false, (this->smallend).vect[1] == (rhs->smallend).vect[1])) {
          bVar1 = (this->smallend).vect[2] == (rhs->smallend).vect[2];
        }
        local_161 = false;
        if (bVar1) {
          local_162 = true;
          if ((rhs->bigend).vect[2] <= (this->bigend).vect[2]) {
            local_171 = false;
            if ((this->bigend).vect[2] == (rhs->bigend).vect[2]) {
              local_172 = true;
              if ((rhs->bigend).vect[1] <= (this->bigend).vect[1]) {
                local_173 = false;
                if ((this->bigend).vect[1] == (rhs->bigend).vect[1]) {
                  local_173 = (this->bigend).vect[0] < (rhs->bigend).vect[0];
                }
                local_172 = local_173;
              }
              local_171 = local_172;
            }
            local_162 = local_171;
          }
          local_161 = local_162;
        }
        local_154 = local_161;
      }
      local_141 = local_154;
    }
    local_131 = local_141;
  }
  return local_131;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    bool operator< (const Box& rhs) const noexcept
    {
        return btype < rhs.btype ||
             ((btype == rhs.btype) &&
                 (  (smallend < rhs.smallend) ||
                   ((smallend == rhs.smallend) && (bigend < rhs.bigend)) ));
    }